

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_ai.cxx
# Opt level: O3

uint32_t __thiscall xray_re::xr_level_ai::vertex_id(xr_level_ai *this,fvector3 *position)

{
  float fVar1;
  uint32_t uVar2;
  ai_node *paVar3;
  ulong uVar4;
  ai_node *paVar5;
  ulong uVar6;
  ulong uVar7;
  uint32_t uVar8;
  long lVar9;
  ai_node *node;
  float fVar10;
  float fVar11;
  ai_node sample;
  uint local_38;
  uint16_t local_34 [2];
  
  vertex_position(this,&local_38,local_34,position);
  paVar3 = this->m_nodes;
  uVar4 = (ulong)this->m_num_nodes;
  paVar5 = paVar3 + uVar4;
  node = paVar3;
  if (uVar4 != 0) {
    do {
      uVar6 = uVar4 >> 1;
      uVar7 = uVar6;
      if (node[uVar6].packed_xz < local_38) {
        uVar7 = ~uVar6 + uVar4;
        node = node + uVar6 + 1;
      }
      uVar4 = uVar7;
    } while (0 < (long)uVar7);
  }
  uVar8 = 0xffffffff;
  if ((node != paVar5) && (uVar2 = node->packed_xz, uVar2 == local_38)) {
    lVar9 = ((long)node - (long)paVar3 >> 2) * 0x6db6db6db6db6db7;
    uVar8 = (uint32_t)lVar9;
    fVar10 = vertex_plane_y(this,node,(position->field_0).field_0.x,(position->field_0).field_0.z);
    paVar3 = node;
    while (paVar3 = paVar3 + 1, paVar3 != paVar5) {
      node = node + 1;
      if (paVar3->packed_xz != uVar2) {
        return (uint32_t)lVar9;
      }
      fVar11 = vertex_plane_y(this,paVar3,(position->field_0).field_0.x,
                              (position->field_0).field_0.z);
      fVar1 = (position->field_0).field_0.y;
      if (fVar10 <= fVar1) {
        if ((fVar11 <= fVar1) && (fVar1 - fVar11 < fVar1 - fVar10)) goto LAB_00167798;
      }
      else if ((fVar11 <= fVar1) || (fVar11 - fVar1 < fVar10 - fVar1)) {
LAB_00167798:
        lVar9 = ((long)node - (long)this->m_nodes >> 2) * 0x6db6db6db6db6db7;
        fVar10 = fVar11;
      }
      uVar8 = (uint32_t)lVar9;
    }
  }
  return uVar8;
}

Assistant:

uint32_t xr_level_ai::vertex_id(const fvector3& position) const
{
	ai_node sample;
	vertex_position(sample.packed_xz, sample.packed_y, position);
	const ai_node* end = m_nodes + m_num_nodes;
	const ai_node* it = std::lower_bound(static_cast<const ai_node*>(m_nodes), end, sample);
	if (it == end || it->packed_xz != sample.packed_xz)
		return AI_MAP_BAD_NODE;

	size_t node_id = it - m_nodes;
	float y0 = vertex_plane_y(*it, position.x, position.z);
	while (++it != end && it->packed_xz == sample.packed_xz) {
		float y = vertex_plane_y(*it, position.x, position.z);
		if (position.y < y0) {
			if (position.y < y && (y0 - position.y) <= (y - position.y))
				continue;
		} else if (position.y < y || (position.y - y0) <= (position.y - y)) {
			continue;
		}
		node_id = it - m_nodes;
		y0 = y;
	}
	return uint32_t(node_id & UINT32_MAX);
}